

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall MxxColl_ScatterGeneral_Test::TestBody(MxxColl_ScatterGeneral_Test *this)

{
  pointer piVar1;
  int iVar2;
  int i;
  long lVar3;
  long lVar4;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> vec;
  comm c;
  vector<int,_std::allocator<int>_> result;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&ompi_mpi_comm_world;
  mxx::comm::comm(&c,(MPI_Comm *)&vec);
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (c.m_rank == 0) {
    std::vector<int,_std::allocator<int>_>::resize(&vec,(long)c.m_size * 5);
    iVar2 = 0;
    piVar1 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (lVar3 = 0; lVar3 < c.m_size; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 2) {
        *(int *)((long)piVar1 + lVar4 * 2) = iVar2 + (int)lVar4;
      }
      piVar1 = piVar1 + 5;
      iVar2 = iVar2 + 3;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector(&result,5,(allocator_type *)&gtest_ar);
  mxx::scatter<int>(vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,5,
                    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,0,&c);
  lVar4 = 0;
  lVar3 = 0;
  do {
    if (lVar3 == 10) {
LAB_0010fcf3:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&result.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vec.super__Vector_base<int,_std::allocator<int>_>);
      mxx::comm::~comm(&c);
      return;
    }
    local_a8.ptr_._0_4_ = c.m_rank * 3 + (int)lVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"2*j+3*c.rank()","result[j]",(int *)&local_a8,
               (int *)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar4));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0x76,message);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      goto LAB_0010fcf3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar3 = lVar3 + 2;
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

TEST(MxxColl, ScatterGeneral) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    size_t msgsize = 5;

    // scatter from 0
    if (c.rank() == 0) {
        vec.resize(c.size()*msgsize);
        for (int i = 0; i < c.size(); ++i) {
            for (size_t j = 0; j < msgsize; ++j)
            {
                vec[i*msgsize + j] = 2*j + 3*i;
            }
        }
    }
    std::vector<int> result(msgsize);
    mxx::scatter(&vec[0], msgsize, &result.front(), 0, c);
    for (int j = 0; j < (int)msgsize; ++j) {
        ASSERT_EQ(2*j+3*c.rank(), result[j]);
    }
}